

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_LAVA_POOL(effect_handler_context_t *context)

{
  wchar_t wVar1;
  loc grid1;
  loc grid2;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  _Bool _Var2;
  wchar_t wVar3;
  int iStack_24;
  wchar_t dist;
  loc_conflict pgrid;
  loc_conflict grid;
  wchar_t r;
  effect_handler_context_t *context_local;
  
  wVar1 = context->radius;
  grid1 = player->grid;
  dist = grid1.y;
  for (pgrid.y = dist - wVar1; pgrid.y <= dist + wVar1; pgrid.y = pgrid.y + L'\x01') {
    iStack_24 = grid1.x;
    for (pgrid.x = iStack_24 - wVar1; pgrid.x <= iStack_24 + wVar1; pgrid.x = pgrid.x + L'\x01') {
      grid2.y = pgrid.y;
      grid2.x = pgrid.x;
      wVar3 = distance(grid1,grid2);
      if ((((wVar3 <= wVar1) &&
           (grid_00.y = pgrid.y, grid_00.x = pgrid.x,
           _Var2 = square_in_bounds_fully((chunk *)cave,grid_00), _Var2)) &&
          (grid_01.y = pgrid.y, grid_01.x = pgrid.x,
          _Var2 = square_ispermanent((chunk *)cave,grid_01), !_Var2)) &&
         (grid_02.y = pgrid.y, grid_02.x = pgrid.x, _Var2 = square_isvault((chunk *)cave,grid_02),
         !_Var2)) {
        grid_03.y = pgrid.y;
        grid_03.x = pgrid.x;
        square_set_feat((chunk *)cave,grid_03,FEAT_LAVA);
      }
    }
  }
  return true;
}

Assistant:

bool effect_handler_LAVA_POOL(effect_handler_context_t *context)
{
	int r = context->radius;
	struct loc grid, pgrid = player->grid;

	/* Everything in range */
	for (grid.y = pgrid.y - r; grid.y <= pgrid.y + r; grid.y++) {
		for (grid.x = pgrid.x - r; grid.x <= pgrid.x + r; grid.x++) {
			int dist = distance(pgrid, grid);

			/* Skip distant grids */
			if (dist > r) continue;

			/* Skip grids that are out of bounds */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip grids that are permanent */
			if (square_ispermanent(cave, grid)) continue;

			/* Skip grids in vaults */
			if (square_isvault(cave, grid)) continue;

			/* Lava now */
			square_set_feat(cave, grid, FEAT_LAVA);
		}
	}
	return true;
}